

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::extMul<8ul,unsigned_char,unsigned_short,(wasm::LaneOrder)0>
          (Literal *__return_storage_ptr__,wasm *this,Literal *a,Literal *b)

{
  Type *other;
  uint uVar1;
  uint uVar2;
  Literal *val;
  long lVar3;
  Literal *this_00;
  undefined1 local_408 [8];
  LaneArray<8UL_*_2> lhs;
  LaneArray<8UL_*_2> rhs;
  LaneArray<8UL> result;
  
  getLanes<unsigned_char,16>((LaneArray<16> *)local_408,this,a);
  getLanes<unsigned_char,16>((LaneArray<16> *)&lhs._M_elems[0xf].type,(wasm *)a,val);
  memset(&rhs._M_elems[0xf].type,0,0xc0);
  other = &result._M_elems[7].type;
  for (lVar3 = 0; lVar3 != 0xc0; lVar3 = lVar3 + 0x18) {
    uVar1 = Literal::geti32((Literal *)(local_408 + lVar3));
    uVar2 = Literal::geti32((Literal *)((long)rhs._M_elems + lVar3 + -8));
    result._M_elems[7].type.id._0_4_ = (uVar2 & 0xff) * (uVar1 & 0xff);
    this_00 = (Literal *)((long)result._M_elems + lVar3 + -8);
    if (this_00 != (Literal *)other) {
      Literal::~Literal(this_00);
      Literal::Literal(this_00,(Literal *)other);
    }
    Literal::~Literal((Literal *)other);
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<8> *)&rhs._M_elems[0xf].type);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)&rhs._M_elems[0xf].type);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)&lhs._M_elems[0xf].type);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_408);
  return __return_storage_ptr__;
}

Assistant:

Literal extMul(const Literal& a, const Literal& b) {
  LaneArray<Lanes* 2> lhs = getLanes<LaneFrom, Lanes * 2>(a);
  LaneArray<Lanes* 2> rhs = getLanes<LaneFrom, Lanes * 2>(b);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lhs[idx].geti32() *
                        (LaneTo)(LaneFrom)rhs[idx].geti32());
  }
  return Literal(result);
}